

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_MSR_reg(DisasContext_conflict1 *s,arg_MSR_reg *a)

{
  TCGContext_conflict1 *s_00;
  uint32_t mask;
  int iVar1;
  TCGTemp *pTVar2;
  uint uVar3;
  TCGv_i32 var;
  
  uVar3 = (uint)s->features;
  if ((uVar3 >> 9 & 1) == 0) {
    mask = msr_mask(s,a->mask,a->r);
    iVar1 = a->rn;
    s_00 = s->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = gen_set_psr(s,mask,a->r,var);
    if (iVar1 != 0) {
      unallocated_encoding_aarch64(s);
    }
  }
  return (uVar3 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MSR_reg(DisasContext *s, arg_MSR_reg *a)
{
    TCGv_i32 tmp;
    uint32_t mask = msr_mask(s, a->mask, a->r);

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    tmp = load_reg(s, a->rn);
    if (gen_set_psr(s, mask, a->r, tmp)) {
        unallocated_encoding(s);
    }
    return true;
}